

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.h
# Opt level: O0

bool __thiscall CNetMsg_Sv_ServerSettings::Pack(CNetMsg_Sv_ServerSettings *this,CMsgPacker *pPacker)

{
  bool bVar1;
  CPacker *in_RSI;
  undefined8 in_RDI;
  int i;
  
  i = (int)((ulong)in_RDI >> 0x20);
  CPacker::AddInt(in_RSI,i);
  CPacker::AddInt(in_RSI,i);
  CPacker::AddInt(in_RSI,i);
  CPacker::AddInt(in_RSI,i);
  CPacker::AddInt(in_RSI,i);
  CPacker::AddInt(in_RSI,i);
  bVar1 = CPacker::Error(in_RSI);
  return bVar1;
}

Assistant:

bool Pack(CMsgPacker *pPacker)
	{
		pPacker->AddInt(m_KickVote);
		pPacker->AddInt(m_KickMin);
		pPacker->AddInt(m_SpecVote);
		pPacker->AddInt(m_TeamLock);
		pPacker->AddInt(m_TeamBalance);
		pPacker->AddInt(m_PlayerSlots);
		return pPacker->Error() != 0;
	}